

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# problem_5.cpp
# Opt level: O1

int main(void)

{
  ostream *poVar1;
  int iVar2;
  Date d;
  Date DStack_28;
  
  Date::Date(&DStack_28,0x7e4,feb,0x1d);
  poVar1 = operator<<((ostream *)&std::cout,&DStack_28);
  std::ios::widen((char)*(undefined8 *)(*(long *)poVar1 + -0x18) + (char)poVar1);
  std::ostream::put((char)poVar1);
  std::ostream::flush();
  iVar2 = 5;
  do {
    Date::add_year(&DStack_28,1);
    poVar1 = operator<<((ostream *)&std::cout,&DStack_28);
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar1 + -0x18) + (char)poVar1);
    std::ostream::put((char)poVar1);
    std::ostream::flush();
    iVar2 = iVar2 + -1;
  } while (iVar2 != 0);
  return 0;
}

Assistant:

int main()
{
	try
	{
		Date d{ 2020, Month::feb, 29 };
		std::cout << d << std::endl;
		for (auto i = 1; i <= 5; ++i)
		{
			d.add_year(1);
			std::cout << d << std::endl;
		}
	}
	catch (const std::exception& e)
	{
		std::cerr << e.what() << std::endl;
	}

	return 0;
}